

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

reentrant_put_transaction<void> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_start_reentrant_dyn_push_copy
          (reentrant_put_transaction<void> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,void *i_source)

{
  void *pvVar1;
  tuple_type *ptVar2;
  Allocation push_data;
  Allocation local_60;
  LfQueueControl *local_48;
  uintptr_t uStack_40;
  undefined8 local_38;
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *plStack_30;
  
  detail::
  LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::try_inplace_allocate
            (&local_60,
             (LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              *)this,i_progress_guarantee,1,true,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             ).super__Head_base<0UL,_density::f_size,_false>._M_head_impl.m_size,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             ).
             super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             .super__Head_base<1UL,_density::f_alignment,_false>._M_head_impl.m_alignment);
  pvVar1 = local_60.m_user_storage;
  if (local_60.m_user_storage == (void *)0x0) {
    plStack_30 = (lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)0x0;
    local_48 = (LfQueueControl *)0x0;
    uStack_40 = 0;
    (__return_storage_ptr__->m_put).m_user_storage = (void *)0x0;
    __return_storage_ptr__->m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    (__return_storage_ptr__->m_put).m_control_block = (LfQueueControl *)0x0;
    (__return_storage_ptr__->m_put).m_next_ptr = 0;
  }
  else {
    ptVar2 = i_type->m_feature_table;
    local_60.m_control_block[1].m_next = (uintptr_t)ptVar2;
    if (ptVar2 == (tuple_type *)0x0) {
      density_tests::detail::assert_failed<>
                ("!empty()",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/runtime_type.h"
                 ,0x373);
      ptVar2 = i_type->m_feature_table;
    }
    (*(ptVar2->
      super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
      ).
      super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
      .
      super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
      .super__Head_base<2UL,_density::f_copy_construct,_false>._M_head_impl.m_function)
              (pvVar1,i_source);
    local_48 = local_60.m_control_block;
    uStack_40 = local_60.m_next_ptr;
    (__return_storage_ptr__->m_put).m_user_storage = local_60.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_60.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_60.m_next_ptr;
    __return_storage_ptr__->m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)this;
    plStack_30 = this;
  }
  local_38 = 0;
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<> try_start_reentrant_dyn_push_copy(
          progress_guarantee   i_progress_guarantee,
          const runtime_type & i_type,
          const void *         i_source)
        {
            auto push_data = try_inplace_allocate(
              i_progress_guarantee, detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());
            if (push_data.m_user_storage == nullptr)
            {
                return reentrant_put_transaction<>();
            }

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.copy_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<void>(PrivateType(), this, push_data);
        }